

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_double_with_integer(void)

{
  undefined8 local_130;
  type_conflict9 local_128;
  undefined1 local_11b;
  undefined1 local_11a [2];
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db;
  undefined1 local_da [2];
  undefined1 local_d8 [8];
  variable data_1;
  undefined8 local_a0;
  type_conflict9 local_98;
  undefined1 local_8b;
  undefined1 local_8a [2];
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3fe,"void append_suite::append_double_with_integer()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_88,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x400,"void append_suite::append_double_with_integer()",local_8a,&local_8b);
  local_98 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_a0 = 0x4014000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","5.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x401,"void append_suite::append_double_with_integer()",&local_98,&local_a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_d8,3.0);
  local_da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                          ((basic_variable<std::allocator<char>_> *)local_d8);
  local_db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x405,"void append_suite::append_double_with_integer()",local_da,&local_db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_118,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_d8,&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_11a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_d8);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x407,"void append_suite::append_double_with_integer()",local_11a,&local_11b);
  local_128 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_d8);
  local_130 = 0x4014000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","5.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x408,"void append_suite::append_double_with_integer()",&local_128,&local_130);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  return;
}

Assistant:

void append_double_with_integer()
{
    {
        variable data(3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        data += variable(2);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 5.0);
    }
    {
        variable data(3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        data += variable(2U);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 5.0);
    }
}